

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tag_scalar.hpp
# Opt level: O3

string_t * __thiscall
cfgfile::tag_scalar_t<QString,_cfgfile::qstring_trait_t>::print
          (string_t *__return_storage_ptr__,tag_scalar_t<QString,_cfgfile::qstring_trait_t> *this,
          int indent)

{
  undefined8 *puVar1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long lVar4;
  QChar QVar5;
  long lVar6;
  undefined8 *puVar7;
  QString value;
  string_t spaces;
  string_t tmp;
  QString local_c0;
  QString local_a8;
  int local_8c;
  long local_88;
  QString local_80;
  QArrayData *local_68;
  char16_t *local_60;
  qsizetype qStack_58;
  string_t local_50;
  tag_scalar_t<QString,_cfgfile::qstring_trait_t> *local_38;
  
  (__return_storage_ptr__->m_str).d.d = (Data *)0x0;
  (__return_storage_ptr__->m_str).d.ptr = (char16_t *)0x0;
  (__return_storage_ptr__->m_str).d.size = 0;
  bVar2 = tag_t<cfgfile::qstring_trait_t>::is_defined(&this->super_tag_t<cfgfile::qstring_trait_t>);
  if (bVar2) {
    local_88 = (long)indent;
    QString::QString(&local_c0,local_88,const_t<cfgfile::qstring_trait_t>::c_tab);
    QString::append((QString *)__return_storage_ptr__);
    if (&(local_c0.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_c0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_c0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_c0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_c0.d.d)->super_QArrayData,2,8);
      }
    }
    QVar5.ucs = (char16_t)__return_storage_ptr__;
    QString::append(QVar5);
    QString::append((QString *)__return_storage_ptr__);
    QString::append(QVar5);
    local_c0.d.d = (this->m_value).d.d;
    local_c0.d.ptr = (this->m_value).d.ptr;
    local_c0.d.size = (this->m_value).d.size;
    if (&(local_c0.d.d)->super_QArrayData == (QArrayData *)0x0) {
      local_c0.d.d = (Data *)0x0;
    }
    else {
      LOCK();
      ((local_c0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_c0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
      LOCK();
      ((local_c0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_c0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
      LOCK();
      ((local_c0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_c0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_c0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_c0.d.d)->super_QArrayData,2,8);
      }
    }
    lVar4 = (ulong)(local_c0.d.size != (local_c0.d.size / 0x50) * 0x50 &&
                   -1 < local_c0.d.size % 0x50) + local_c0.d.size / 0x50;
    if (lVar4 == 0) {
      QString::append(QVar5);
      QString::append(QVar5);
    }
    else {
      local_8c = indent;
      local_38 = this;
      QString::QString(&local_a8,
                       (long)((int)(this->super_tag_t<cfgfile::qstring_trait_t>).m_name.m_str.d.size
                             + 2),const_t<cfgfile::qstring_trait_t>::c_space);
      if (0 < lVar4) {
        lVar6 = 0;
        do {
          if (lVar6 != 0) {
            QString::append(QVar5);
            QString::QString(&local_80,local_88,const_t<cfgfile::qstring_trait_t>::c_tab);
            QString::append((QString *)__return_storage_ptr__);
            if (&(local_80.d.d)->super_QArrayData != (QArrayData *)0x0) {
              LOCK();
              ((local_80.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                   ((local_80.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                   -1;
              UNLOCK();
              if (((local_80.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
                  0) {
                QArrayData::deallocate(&(local_80.d.d)->super_QArrayData,2,8);
              }
            }
            QString::append((QString *)__return_storage_ptr__);
          }
          QString::mid((longlong)&local_68,(longlong)&local_c0);
          local_50.m_str.d.d = (Data *)local_68;
          local_50.m_str.d.ptr = local_60;
          local_50.m_str.d.size = qStack_58;
          if (local_68 != (QArrayData *)0x0) {
            LOCK();
            (local_68->ref_)._q_value.super___atomic_base<int>._M_i =
                 (local_68->ref_)._q_value.super___atomic_base<int>._M_i + 1;
            UNLOCK();
          }
          to_cfgfile_format<cfgfile::qstring_trait_t>((string_t *)&local_80,&local_50);
          if (&(local_50.m_str.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_50.m_str.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_50.m_str.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                 _M_i + -1;
            UNLOCK();
            if (((local_50.m_str.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                == 0) {
              QArrayData::deallocate(&(local_50.m_str.d.d)->super_QArrayData,2,8);
            }
          }
          if (local_68 != (QArrayData *)0x0) {
            LOCK();
            (local_68->ref_)._q_value.super___atomic_base<int>._M_i =
                 (local_68->ref_)._q_value.super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((local_68->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate(local_68,2,8);
            }
          }
          QString::append((QString *)__return_storage_ptr__);
          if (&(local_80.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_80.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_80.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
            ;
            UNLOCK();
            if (((local_80.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate(&(local_80.d.d)->super_QArrayData,2,8);
            }
          }
          lVar6 = lVar6 + 1;
        } while (lVar4 != lVar6);
      }
      this = local_38;
      indent = local_8c;
      if (&(local_a8.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_a8.d.d)->super_QArrayData,2,8);
          this = local_38;
          indent = local_8c;
        }
      }
    }
    iVar3 = (*(this->super_tag_t<cfgfile::qstring_trait_t>)._vptr_tag_t[2])(this);
    if (*(long *)CONCAT44(extraout_var,iVar3) != ((long *)CONCAT44(extraout_var,iVar3))[1]) {
      QString::append(QVar5);
      iVar3 = (*(this->super_tag_t<cfgfile::qstring_trait_t>)._vptr_tag_t[2])(this);
      puVar7 = *(undefined8 **)CONCAT44(extraout_var_00,iVar3);
      puVar1 = (undefined8 *)((long *)CONCAT44(extraout_var_00,iVar3))[1];
      if (puVar7 != puVar1) {
        do {
          (**(code **)(*(long *)*puVar7 + 0x18))(&local_a8,(long *)*puVar7,indent + 1);
          QString::append((QString *)__return_storage_ptr__);
          if (&(local_a8.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
            ;
            UNLOCK();
            if (((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate(&(local_a8.d.d)->super_QArrayData,2,8);
            }
          }
          puVar7 = puVar7 + 1;
        } while (puVar7 != puVar1);
      }
      QString::QString(&local_a8,local_88,const_t<cfgfile::qstring_trait_t>::c_tab);
      QString::append((QString *)__return_storage_ptr__);
      if (&(local_a8.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_a8.d.d)->super_QArrayData,2,8);
        }
      }
    }
    QString::append(QVar5);
    QString::append(QVar5);
    if (&(local_c0.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_c0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_c0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_c0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_c0.d.d)->super_QArrayData,2,8);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

typename Trait::string_t print( int indent = 0 ) const override
	{
		typename Trait::string_t result;

		if( this->is_defined() )
		{
			result.append( typename Trait::string_t( indent,
				const_t< Trait >::c_tab ) );

			result.push_back( const_t< Trait >::c_begin_tag );
			result.append( this->name() );
			result.push_back( const_t< Trait >::c_space );

			QString value = format_t< QString, Trait >::to_string( m_value );

			const typename Trait::pos_t sections =
				( value.length() / c_max_string_length +
				( value.length() % c_max_string_length > 0 ? 1 : 0 ) );

			if( sections )
			{
				const typename Trait::string_t spaces = typename Trait::string_t(
					this->name().length() + 2, const_t< Trait >::c_space );

				for( typename Trait::pos_t i = 0; i < sections; ++i )
				{
					if( i > 0 )
					{
						result.push_back( const_t< Trait >::c_carriage_return );

						result.append( typename Trait::string_t( indent,
							const_t< Trait >::c_tab ) );

						result.append( spaces );
					}

					const typename Trait::string_t tmp =
						to_cfgfile_format< Trait >(
							value.mid( i * c_max_string_length,
								c_max_string_length ) );

					result.append( tmp );
				}
			}
			else
			{
				result.push_back( const_t< Trait >::c_quotes );
				result.push_back( const_t< Trait >::c_quotes );
			}

			if( !this->children().empty() )
			{
				result.push_back( const_t< Trait >::c_carriage_return );

				for( const tag_t< Trait > * tag : this->children() )
					result.append( tag->print( indent + 1 ) );

				result.append( typename Trait::string_t( indent,
					const_t< Trait >::c_tab ) );
			}

			result.push_back( const_t< Trait >::c_end_tag );
			result.push_back( const_t< Trait >::c_carriage_return );
		}

		return result;
	}